

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::write
          (BlockedPumpTo *this,int __fd,void *__buf,size_t __n)

{
  PromiseArenaMember *pPVar1;
  Detail *pDVar2;
  PromiseArena *pPVar3;
  Fault FVar4;
  BlockedPumpTo *pBVar5;
  PromiseBase PVar6;
  size_t sVar7;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  void *pvVar10;
  _func_int *p_Var11;
  char *pcVar12;
  _func_int *p_Var13;
  undefined4 in_register_00000034;
  Detail *pDVar14;
  TransformPromiseNodeBase *pTVar15;
  OwnPromiseNode OVar16;
  ArrayDisposer *pAVar17;
  _func_int *p_Var18;
  bool bVar19;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_d7;
  OwnPromiseNode local_c8;
  _func_int **local_c0;
  BlockedPumpTo *local_b8;
  ArrayDisposer **local_b0;
  PromiseBase local_a8;
  PromiseBase local_a0;
  char *local_98;
  void *local_90;
  Fault f;
  size_t size;
  _func_int *local_58;
  ArrayDisposer *local_50;
  char *local_48;
  _func_int **local_40;
  OwnPromiseNode local_38;
  
  pDVar14 = (Detail *)CONCAT44(in_register_00000034,__fd);
  bVar19 = pDVar14[1].value.disposer == (ArrayDisposer *)0x0;
  _kjCondition.value = bVar19;
  local_90 = __buf;
  if (!bVar19) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4ee,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  local_b0 = &pDVar14[1].value.disposer;
  size = 0;
  local_b8 = this;
  local_98 = (char *)__n;
  if (__n != 0) {
    pAVar17 = (ArrayDisposer *)((long)__buf + 8);
    pcVar12 = (char *)0x0;
    pp_Var8 = (_func_int **)(pDVar14[1].value.ptr + -pDVar14[1].value.size_);
    do {
      local_40 = pAVar17->_vptr_ArrayDisposer;
      pp_Var9 = (_func_int **)((long)pp_Var8 - (long)local_40);
      local_50 = pAVar17;
      local_48 = pcVar12;
      if (pp_Var8 < local_40) {
        local_c0 = pp_Var8;
        (**(code **)(*(long *)pDVar14[1].id + 8))(this,(long *)pDVar14[1].id,local_90,pcVar12);
        if (local_c0 == (_func_int **)0x0) {
          p_Var11 = (_func_int *)(pDVar14->value).size_;
          pp_Var8 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                    _vptr_AsyncInputStream;
          p_Var13 = pp_Var8[1];
          if (p_Var13 == (_func_int *)0x0 || (ulong)((long)pp_Var8 - (long)p_Var13) < 0x38) {
            pvVar10 = operator_new(0x400);
            OVar16.ptr = (PromiseNode *)((long)pvVar10 + 0x3c8);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      ((TransformPromiseNodeBase *)OVar16.ptr,(OwnPromiseNode *)this,
                       kj::_::
                       TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1289:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
                       ::anon_class_8_1_8991fb9c_for_func::operator());
            *(undefined ***)((long)pvVar10 + 0x3c8) = &PTR_destroy_00646d98;
            *(Detail **)((long)pvVar10 + 1000) = pDVar14;
            *(_func_int **)((long)pvVar10 + 0x3f0) = p_Var11;
            *(ArrayDisposer ***)((long)pvVar10 + 0x3f8) = local_b0;
            *(void **)((long)pvVar10 + 0x3d0) = pvVar10;
          }
          else {
            pp_Var8[1] = (_func_int *)0x0;
            OVar16.ptr = (PromiseNode *)(pp_Var8 + -7);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      ((TransformPromiseNodeBase *)OVar16.ptr,(OwnPromiseNode *)this,
                       kj::_::
                       TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1289:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
                       ::anon_class_8_1_8991fb9c_for_func::operator());
            pp_Var8[-7] = (_func_int *)&PTR_destroy_00646d98;
            pp_Var8[-3] = (_func_int *)pDVar14;
            pp_Var8[-2] = p_Var11;
            pp_Var8[-1] = (_func_int *)local_b0;
            pp_Var8[-6] = p_Var13;
            this = local_b8;
          }
          local_a8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OVar16.ptr;
          kj::_::PromiseDisposer::
          alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
                    ((PromiseDisposer *)&f,(Canceler *)local_b0,(Promise<void> *)&local_a8);
          __n = (size_t)local_98;
          pPVar1 = (PromiseArenaMember *)
                   (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                   _vptr_AsyncInputStream;
          (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = (_func_int **)f.exception;
          if (pPVar1 != (PromiseArenaMember *)0x0) {
            kj::_::PromiseDisposer::dispose(pPVar1);
          }
          PVar6.node.ptr = local_a8.node.ptr;
          if (local_a8.node.ptr != (PromiseNode *)0x0) {
            local_a8.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar6.node.ptr);
          }
        }
        else {
          pp_Var8 = pAVar17[-1]._vptr_ArrayDisposer;
          pp_Var9 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                    _vptr_AsyncInputStream;
          p_Var11 = pp_Var9[1];
          if (p_Var11 == (_func_int *)0x0 || (ulong)((long)pp_Var9 - (long)p_Var11) < 0x38) {
            pvVar10 = operator_new(0x400);
            pTVar15 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3c8);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar15,(OwnPromiseNode *)this,
                       kj::_::
                       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1276:36)>
                       ::anon_class_24_2_9ee7ec2e_for_func::operator());
            *(undefined ***)((long)pvVar10 + 0x3c8) = &PTR_destroy_00646ce8;
            *(Detail **)((long)pvVar10 + 1000) = pDVar14;
            *(_func_int ***)((long)pvVar10 + 0x3f0) = pp_Var8;
            *(_func_int ***)((long)pvVar10 + 0x3f8) = local_c0;
            *(void **)((long)pvVar10 + 0x3d0) = pvVar10;
          }
          else {
            pp_Var9[1] = (_func_int *)0x0;
            pTVar15 = (TransformPromiseNodeBase *)(pp_Var9 + -7);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar15,(OwnPromiseNode *)this,
                       kj::_::
                       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1276:36)>
                       ::anon_class_24_2_9ee7ec2e_for_func::operator());
            pp_Var9[-7] = (_func_int *)&PTR_destroy_00646ce8;
            pp_Var9[-3] = (_func_int *)pDVar14;
            pp_Var9[-2] = (_func_int *)pp_Var8;
            pp_Var9[-1] = (_func_int *)local_c0;
            pp_Var9[-6] = p_Var11;
            this = local_b8;
          }
          f.exception = (Exception *)&DAT_004a8171;
          local_c8.ptr = &pTVar15->super_PromiseNode;
          kj::_::PromiseDisposer::
          appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                    ((PromiseDisposer *)&_kjCondition,&local_c8,(SourceLocation *)&f);
          pAVar17 = local_50;
          OVar16.ptr = local_c8.ptr;
          FVar4.exception = __kjCondition;
          if ((TransformPromiseNodeBase *)local_c8.ptr != (TransformPromiseNodeBase *)0x0) {
            local_c8.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(&(OVar16.ptr)->super_PromiseArenaMember);
          }
          pPVar1 = (PromiseArenaMember *)
                   (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                   _vptr_AsyncInputStream;
          (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = (_func_int **)FVar4.exception;
          if (pPVar1 != (PromiseArenaMember *)0x0) {
            kj::_::PromiseDisposer::dispose(pPVar1);
          }
          p_Var13 = (_func_int *)((long)pAVar17[-1]._vptr_ArrayDisposer + (long)local_c0);
          p_Var18 = (_func_int *)((long)pAVar17->_vptr_ArrayDisposer - (long)local_c0);
          local_58 = (_func_int *)(pDVar14->value).size_;
          pp_Var8 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                    _vptr_AsyncInputStream;
          p_Var11 = pp_Var8[1];
          if (p_Var11 == (_func_int *)0x0 || (ulong)((long)pp_Var8 - (long)p_Var11) < 0x48) {
            pvVar10 = operator_new(0x400);
            pTVar15 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3b8);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar15,(OwnPromiseNode *)this,
                       kj::_::
                       TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1280:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                       ::anon_class_24_2_79c18d0c_for_func::operator());
            *(undefined ***)((long)pvVar10 + 0x3b8) = &PTR_destroy_00646d40;
            *(Detail **)((long)pvVar10 + 0x3d8) = pDVar14;
            *(_func_int **)((long)pvVar10 + 0x3e0) = p_Var13;
            *(_func_int **)((long)pvVar10 + 1000) = p_Var18;
            *(_func_int **)((long)pvVar10 + 0x3f0) = local_58;
            *(ArrayDisposer ***)((long)pvVar10 + 0x3f8) = local_b0;
            *(void **)((long)pvVar10 + 0x3c0) = pvVar10;
          }
          else {
            pp_Var8[1] = (_func_int *)0x0;
            pTVar15 = (TransformPromiseNodeBase *)(pp_Var8 + -9);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar15,(OwnPromiseNode *)this,
                       kj::_::
                       TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1280:50),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                       ::anon_class_24_2_79c18d0c_for_func::operator());
            pp_Var8[-9] = (_func_int *)&PTR_destroy_00646d40;
            pp_Var8[-5] = (_func_int *)pDVar14;
            pp_Var8[-4] = p_Var13;
            pp_Var8[-3] = p_Var18;
            pp_Var8[-2] = local_58;
            pp_Var8[-1] = (_func_int *)local_b0;
            pp_Var8[-8] = p_Var11;
            this = local_b8;
          }
          f.exception = (Exception *)anon_var_dwarf_a0474c;
          local_c8.ptr = &pTVar15->super_PromiseNode;
          kj::_::PromiseDisposer::
          appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                    ((PromiseDisposer *)&_kjCondition,&local_c8,(SourceLocation *)&f);
          __n = (size_t)local_98;
          OVar16.ptr = local_c8.ptr;
          local_a0.node.ptr = (OwnPromiseNode)(OwnPromiseNode)__kjCondition;
          if ((TransformPromiseNodeBase *)local_c8.ptr != (TransformPromiseNodeBase *)0x0) {
            local_c8.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(&(OVar16.ptr)->super_PromiseArenaMember);
          }
          kj::_::PromiseDisposer::
          alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
                    ((PromiseDisposer *)&f,(Canceler *)local_b0,(Promise<void> *)&local_a0);
          pPVar1 = (PromiseArenaMember *)
                   (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                   _vptr_AsyncInputStream;
          (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = (_func_int **)f.exception;
          if (pPVar1 != (PromiseArenaMember *)0x0) {
            kj::_::PromiseDisposer::dispose(pPVar1);
          }
          PVar6.node.ptr = local_a0.node.ptr;
          if (local_a0.node.ptr != (PromiseNode *)0x0) {
            local_a0.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar6.node.ptr);
          }
          pcVar12 = pcVar12 + 1;
        }
        p_Var11 = (_func_int *)(__n + -(long)pcVar12);
        pp_Var9 = local_c0;
        pp_Var8 = local_c0;
        if (p_Var11 != (_func_int *)0x0) {
          p_Var18 = (_func_int *)((long)pcVar12 * 0x10 + (long)local_90);
          pAVar17 = (pDVar14->value).disposer;
          pp_Var8 = (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                    _vptr_AsyncInputStream;
          p_Var13 = pp_Var8[1];
          if (p_Var13 == (_func_int *)0x0 || (ulong)((long)pp_Var8 - (long)p_Var13) < 0x38) {
            pvVar10 = operator_new(0x400);
            pTVar15 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3c8);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar15,(OwnPromiseNode *)this,
                       kj::_::
                       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1299:36)>
                       ::anon_class_24_2_c249a869_for_func::operator());
            *(undefined ***)((long)pvVar10 + 0x3c8) = &PTR_destroy_00646df0;
            *(ArrayDisposer **)((long)pvVar10 + 1000) = pAVar17;
            *(_func_int **)((long)pvVar10 + 0x3f0) = p_Var18;
            *(_func_int **)((long)pvVar10 + 0x3f8) = p_Var11;
            *(void **)((long)pvVar10 + 0x3d0) = pvVar10;
          }
          else {
            pp_Var8[1] = (_func_int *)0x0;
            pTVar15 = (TransformPromiseNodeBase *)(pp_Var8 + -7);
            kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                      (pTVar15,(OwnPromiseNode *)this,
                       kj::_::
                       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1299:36)>
                       ::anon_class_24_2_c249a869_for_func::operator());
            pp_Var8[-7] = (_func_int *)&PTR_destroy_00646df0;
            pp_Var8[-3] = (_func_int *)pAVar17;
            pp_Var8[-2] = p_Var18;
            pp_Var8[-1] = p_Var11;
            pp_Var8[-6] = p_Var13;
            this = local_b8;
          }
          f.exception = (Exception *)&DAT_004a8171;
          local_c8.ptr = &pTVar15->super_PromiseNode;
          kj::_::PromiseDisposer::
          appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                    ((PromiseDisposer *)&_kjCondition,&local_c8,(SourceLocation *)&f);
          pp_Var9 = local_c0;
          OVar16.ptr = local_c8.ptr;
          FVar4.exception = __kjCondition;
          if ((TransformPromiseNodeBase *)local_c8.ptr != (TransformPromiseNodeBase *)0x0) {
            local_c8.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(&(OVar16.ptr)->super_PromiseArenaMember);
          }
          __n = (size_t)local_98;
          pPVar1 = (PromiseArenaMember *)
                   (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                   _vptr_AsyncInputStream;
          (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = (_func_int **)FVar4.exception;
          pp_Var8 = pp_Var9;
          if (pPVar1 != (PromiseArenaMember *)0x0) {
            kj::_::PromiseDisposer::dispose(pPVar1);
          }
        }
      }
      else {
        size = size + (long)local_40;
      }
      if (pp_Var8 < local_40) {
        return (ssize_t)this;
      }
      pcVar12 = local_48 + 1;
      pAVar17 = local_50 + 2;
      pp_Var8 = pp_Var9;
      local_c0 = pp_Var9;
    } while ((char *)__n != pcVar12);
  }
  f.exception = (Exception *)&size;
  if (size <= (long)pDVar14[1].value.ptr - pDVar14[1].value.size_) {
    (**(code **)(*(long *)pDVar14[1].id + 8))(&_kjCondition,(long *)pDVar14[1].id,local_90,local_98)
    ;
    sVar7 = size;
    FVar4.exception = __kjCondition;
    pDVar2 = (Detail *)(pDVar14->value).size_;
    pPVar3 = (PromiseArena *)(__kjCondition->ownFile).content.size_;
    if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)__kjCondition - (long)pPVar3) < 0x40) {
      pvVar10 = operator_new(0x400);
      pTVar15 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3c0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar15,(OwnPromiseNode *)&_kjCondition,
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1313:54),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
                 ::anon_class_16_2_3fe5c9bc_for_func::operator());
      *(undefined ***)((long)pvVar10 + 0x3c0) = &PTR_destroy_00646e48;
      *(Detail **)((long)pvVar10 + 0x3e0) = pDVar14;
      *(size_t *)((long)pvVar10 + 1000) = sVar7;
      *(Detail **)((long)pvVar10 + 0x3f0) = pDVar2;
      *(ArrayDisposer ***)((long)pvVar10 + 0x3f8) = local_b0;
      *(void **)((long)pvVar10 + 0x3c8) = pvVar10;
    }
    else {
      (__kjCondition->ownFile).content.size_ = 0;
      pTVar15 = (TransformPromiseNodeBase *)(__kjCondition[-1].trace + 0x1d);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar15,(OwnPromiseNode *)&_kjCondition,
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1313:54),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:430:12)>
                 ::anon_class_16_2_3fe5c9bc_for_func::operator());
      FVar4.exception[-1].trace[0x1d] = &PTR_destroy_00646e48;
      FVar4.exception[-1].details.builder.ptr = pDVar14;
      FVar4.exception[-1].details.builder.pos = (RemoveConst<kj::Exception::Detail> *)sVar7;
      FVar4.exception[-1].details.builder.endPtr = pDVar2;
      FVar4.exception[-1].details.builder.disposer = (ArrayDisposer *)local_b0;
      FVar4.exception[-1].trace[0x1e] = pPVar3;
    }
    local_38.ptr = &pTVar15->super_PromiseNode;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
              ((PromiseDisposer *)&f,(Canceler *)local_b0,(Promise<void> *)&local_38);
    OVar16.ptr = local_38.ptr;
    pBVar5 = local_b8;
    (local_b8->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)f.exception;
    if ((TransformPromiseNodeBase *)local_38.ptr != (TransformPromiseNodeBase *)0x0) {
      local_38.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar16.ptr)->super_PromiseArenaMember);
    }
    FVar4.exception = __kjCondition;
    if (__kjCondition != (Exception *)0x0) {
      __kjCondition = (Exception *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)FVar4.exception);
    }
    return (ssize_t)pBVar5;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x520,FAILED,"size <= amount - pumpedSoFar","_kjCondition,",
             (DebugComparison<unsigned_long_&,_unsigned_long> *)&f);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      size_t size = 0;
      size_t needed = amount - pumpedSoFar;
      for (auto i: kj::indices(pieces)) {
        if (pieces[i].size() > needed) {
          // The pump ends in the middle of this write.

          auto promise = output.write(pieces.first(i));

          if (needed > 0) {
            // The pump includes part of this piece, but not all. Unfortunately we need to split
            // writes.
            auto partial = pieces[i].first(needed);
            promise = promise.then([this,partial]() {
              return output.write(partial);
            });
            auto partial2 = pieces[i].slice(needed, pieces[i].size());
            promise = canceler.wrap(promise.then([this,partial2]() {
              canceler.release();
              fulfiller.fulfill(kj::cp(amount));
              pipe.endState(*this);
              return pipe.write(partial2);
            }, teeExceptionPromise<void>(fulfiller, canceler)));
            ++i;
          } else {
            // The pump ends exactly at the end of a piece, how nice.
            promise = canceler.wrap(promise.then([this]() {
              canceler.release();
              fulfiller.fulfill(kj::cp(amount));
              pipe.endState(*this);
            }, teeExceptionVoid(fulfiller, canceler)));
          }

          auto remainder = pieces.slice(i, pieces.size());
          if (remainder.size() > 0) {
            auto& pipeRef = pipe;
            promise = promise.then([&pipeRef,remainder]() {
              return pipeRef.write(remainder);
            });
          }

          return promise;
        } else {
          size += pieces[i].size();
          needed -= pieces[i].size();
        }
      }

      // Turns out we can forward this whole write.
      KJ_ASSERT(size <= amount - pumpedSoFar);
      return canceler.wrap(output.write(pieces).then([this,size]() {
        pumpedSoFar += size;
        KJ_ASSERT(pumpedSoFar <= amount);
        if (pumpedSoFar == amount) {
          // Done pumping.
          canceler.release();
          fulfiller.fulfill(kj::cp(amount));
          pipe.endState(*this);
        }
      }, teeExceptionVoid(fulfiller, canceler)));
    }